

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O2

char * mserialize::detail::write_integer_as_hex<unsigned_char>(uchar v,char *end)

{
  undefined3 in_register_00000039;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000039,v);
  if (uVar1 == 0) {
    end[-1] = '0';
    end = end + -1;
  }
  else {
    for (; (byte)uVar1 != 0; uVar1 = (uint)(byte)((byte)uVar1 >> 4)) {
      end[-1] = "0123456789ABCDEF"[uVar1 & 0xf];
      end = end + -1;
    }
  }
  return end;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}